

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TexSubImage2DEmptyTexCase::createTexture(TexSubImage2DEmptyTexCase *this)

{
  deUint32 type;
  float height;
  float width;
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  char *str;
  void *data_00;
  int local_13c;
  PixelBufferAccess local_130;
  PixelBufferAccess local_108;
  Vector<float,_4> local_dc;
  Vector<float,_4> local_cc;
  undefined1 local_bc [8];
  Vec4 gMax;
  Vector<float,_4> local_9c;
  undefined1 local_8c [8];
  Vec4 gMin;
  int levelH_1;
  int levelW_1;
  int ndx_1;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_58 [8];
  Random rnd;
  TextureLevel data;
  deUint32 tex;
  int numLevels;
  TextureFormat fmt;
  TexSubImage2DEmptyTexCase *this_local;
  
  _tex = (this->super_TextureSpecCase).m_texFormat;
  fmt = (TextureFormat)this;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_13c = 1;
  }
  else {
    iVar1 = ::deLog2Floor32((this->super_TextureSpecCase).m_width);
    iVar2 = ::deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_13c = de::max<int>(iVar1,iVar2);
    local_13c = local_13c + 1;
  }
  data.m_data.m_cap._4_4_ = local_13c;
  data.m_data.m_cap._0_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&tex);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)local_58,dVar3);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,(deUint32 *)&data.m_data.m_cap);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,(deUint32)data.m_data.m_cap);
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  for (levelH = 0; levelH < data.m_data.m_cap._4_4_; levelH = levelH + 1) {
    iVar1 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
    iVar2 = de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,levelH,this->m_format,iVar1
               ,iVar2,0,this->m_format,this->m_dataType,(void *)0x0);
  }
  for (levelH_1 = 0; levelH_1 < data.m_data.m_cap._4_4_; levelH_1 = levelH_1 + 1) {
    gMin.m_data[3] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH_1 & 0x1f));
    gMin.m_data[2] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH_1 & 0x1f));
    tcu::Vector<float,_4>::Vector(&local_9c,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),1.0);
    randomVector<4>((Functional *)local_8c,(Random *)local_58,&local_9c,
                    (Vector<float,_4> *)(gMax.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_cc,0.0);
    tcu::Vector<float,_4>::Vector(&local_dc,1.0);
    randomVector<4>((Functional *)local_bc,(Random *)local_58,&local_cc,&local_dc);
    tcu::TextureLevel::setSize
              ((TextureLevel *)&rnd.m_rnd.z,(int)gMin.m_data[3],(int)gMin.m_data[2],1);
    tcu::TextureLevel::getAccess(&local_108,(TextureLevel *)&rnd.m_rnd.z);
    tcu::fillWithComponentGradients(&local_108,(Vec4 *)local_8c,(Vec4 *)local_bc);
    width = gMin.m_data[3];
    height = gMin.m_data[2];
    dVar3 = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_130,(TextureLevel *)&rnd.m_rnd.z);
    data_00 = tcu::PixelBufferAccess::getDataPtr(&local_130);
    sglr::ContextWrapper::glTexSubImage2D
              (&(this->super_TextureSpecCase).super_ContextWrapper,0xde1,levelH_1,0,0,(int)width,
               (int)height,dVar3,type,data_00);
  }
  de::Random::~Random((Random *)local_58);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First allocate storage for each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify pixel data to all levels using glTexSubImage2D()
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}